

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O1

void __thiscall kj::Thread::detach(Thread *this)

{
  int iVar1;
  Fault f;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar1 = pthread_detach(this->threadId);
  if (iVar1 != 0) {
    local_30.exception = (Exception *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    kj::_::Debug::Fault::init
              (&local_30,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
              );
    kj::_::Debug::Fault::~Fault(&local_30);
  }
  this->detached = true;
  ThreadState::unref(this->state);
  return;
}

Assistant:

void Thread::detach() {
  int pthreadResult = pthread_detach(*reinterpret_cast<pthread_t*>(&threadId));
  if (pthreadResult != 0) {
    KJ_FAIL_SYSCALL("pthread_detach", pthreadResult) { break; }
  }
  detached = true;
  state->unref();
}